

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Response *res)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  __ssize_t _Var3;
  string *psVar4;
  FILE *in_RCX;
  long lVar5;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *__n_00;
  size_t *extraout_RDX_00;
  string_type *__lineptr;
  sub_match<const_char_*> *psVar6;
  bool bVar7;
  cmatch m;
  string_type local_890;
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  
  this_00 = &line_reader.glowable_buffer_;
  line_reader.fixed_buffer_ = buf._M_elems;
  line_reader.fixed_buffer_size_ = 0x800;
  line_reader.fixed_buffer_used_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)&line_reader.glowable_buffer_.field_2;
  line_reader.glowable_buffer_._M_string_length = 0;
  line_reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  line_reader.strm_ = strm;
  _Var3 = detail::stream_line_reader::getline(&line_reader,(char **)strm,(size_t *)res,in_RCX);
  if ((char)_Var3 == '\0') {
    bVar7 = false;
  }
  else {
    if (read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Response&)::
                                   re_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                   "(HTTP/1\\.[01]) (\\d+) (.*?)\r\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_)
        ;
      }
    }
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m._M_begin = (char *)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar4 = this_00;
    if (line_reader.glowable_buffer_._M_string_length == 0) {
      psVar4 = (string *)&line_reader.fixed_buffer_;
    }
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      ((psVar4->_M_dataplus)._M_p,&m,
                       &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,0);
    bVar7 = true;
    if (bVar1) {
      lVar5 = (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
        psVar6 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
      }
      else {
        psVar6 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
      std::__cxx11::string::operator=((string *)res,(string *)&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      lVar5 = (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)m.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar5 == 0) || (0xfffffffffffffffc < lVar5 / 0x18 - 6U)) {
        psVar6 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
      }
      else {
        psVar6 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
      iVar2 = std::__cxx11::stoi(&local_890,(size_t *)0x0,10);
      res->status = iVar2;
      std::__cxx11::string::~string((string *)&local_890);
      __stream = (FILE *)((long)m.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)m.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      if ((__stream == (FILE *)0x0) || (0xfffffffffffffffb < (long)__stream / 0x18 - 7U)) {
        psVar6 = (sub_match<const_char_*> *)
                 ((long)m.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)__stream + -0x48);
      }
      else {
        psVar6 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3;
      }
      std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
      __lineptr = &local_890;
      std::__cxx11::string::operator=((string *)&res->reason,(string *)&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      __n = extraout_RDX;
      while (bVar7 = res->status != 100, !bVar7) {
        _Var3 = detail::stream_line_reader::getline(&line_reader,(char **)__lineptr,__n,__stream);
        if ((char)_Var3 == '\0') break;
        _Var3 = detail::stream_line_reader::getline(&line_reader,(char **)__lineptr,__n_00,__stream)
        ;
        if ((char)_Var3 == '\0') break;
        psVar4 = this_00;
        if (line_reader.glowable_buffer_._M_string_length == 0) {
          psVar4 = (string *)&line_reader.fixed_buffer_;
        }
        bVar1 = std::
                regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                          ((psVar4->_M_dataplus)._M_p,&m,
                           &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,0
                          );
        if (!bVar1) break;
        lVar5 = (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
          psVar6 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
        }
        else {
          psVar6 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
        std::__cxx11::string::operator=((string *)res,(string *)&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        lVar5 = (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)m.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar5 == 0) || (0xfffffffffffffffc < lVar5 / 0x18 - 6U)) {
          psVar6 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48);
        }
        else {
          psVar6 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
        iVar2 = std::__cxx11::stoi(&local_890,(size_t *)0x0,10);
        res->status = iVar2;
        std::__cxx11::string::~string((string *)&local_890);
        __stream = (FILE *)((long)m.
                                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)m.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        if ((__stream == (FILE *)0x0) || (0xfffffffffffffffb < (long)__stream / 0x18 - 7U)) {
          psVar6 = (sub_match<const_char_*> *)
                   ((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)__stream + -0x48);
        }
        else {
          psVar6 = m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 3;
        }
        std::__cxx11::sub_match<const_char_*>::str(&local_890,psVar6);
        __lineptr = &local_890;
        std::__cxx11::string::operator=((string *)&res->reason,(string *)&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        __n = extraout_RDX_00;
      }
    }
    std::
    _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)&m);
  }
  std::__cxx11::string::~string((string *)this_00);
  return bVar7;
}

Assistant:

stream_line_reader(Stream &strm, char *fixed_buffer, size_t fixed_buffer_size)
      : strm_(strm), fixed_buffer_(fixed_buffer),
        fixed_buffer_size_(fixed_buffer_size) {}